

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O2

void Saig_BmcManStop(Saig_Bmc_t *p)

{
  Vec_Ptr_t *p_00;
  int i;
  long lVar1;
  
  Aig_ManStop(p->pFrm);
  p_00 = p->vAig2Frm;
  for (lVar1 = 0; lVar1 < p_00->nSize; lVar1 = lVar1 + 1) {
    if ((Vec_Ptr_t *)p_00->pArray[lVar1] != (Vec_Ptr_t *)0x0) {
      Vec_PtrFree((Vec_Ptr_t *)p_00->pArray[lVar1]);
    }
  }
  Vec_PtrFree(p_00);
  Vec_IntFree(p->vObj2Var);
  if (p->pSat != (sat_solver *)0x0) {
    sat_solver_delete(p->pSat);
  }
  if (p->pSat2 != (solver_t *)0x0) {
    satoko_destroy(p->pSat2);
  }
  Vec_PtrFree(p->vTargets);
  Vec_IntFree(p->vVisited);
  free(p);
  return;
}

Assistant:

void Saig_BmcManStop( Saig_Bmc_t * p )
{
    Aig_ManStop( p->pFrm  );
    Vec_VecFree( (Vec_Vec_t *)p->vAig2Frm );
    Vec_IntFree( p->vObj2Var );
    if ( p->pSat )  sat_solver_delete( p->pSat );
    if ( p->pSat2 ) satoko_destroy( p->pSat2 );
    Vec_PtrFree( p->vTargets );
    Vec_IntFree( p->vVisited );
    ABC_FREE( p );
}